

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O2

void av1_highbd_convolve_x_sr_avx2
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined2 uVar13;
  long lVar14;
  undefined2 uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  undefined1 (*pauVar20) [16];
  undefined1 (*pauVar21) [32];
  long lVar22;
  undefined1 (*pauVar23) [32];
  __m256i coeffs_x [4];
  __m256i local_e0;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  if (filter_params_x->taps == 0xc) {
    av1_highbd_convolve_x_sr_ssse3
              (src,src_stride,dst,dst_stride,w,h,filter_params_x,subpel_x_qn,conv_params,bd);
  }
  else {
    pauVar21 = (undefined1 (*) [32])(src + (1 - (ulong)(filter_params_x->taps >> 1)));
    iVar16 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
    uVar17 = 7 - conv_params->round_0;
    uVar1 = conv_params->round_0;
    iVar18 = (1 << ((byte)uVar17 & 0x1f)) >> 1;
    uVar15 = 0xff;
    if (bd == 0xc) {
      uVar15 = 0xfff;
    }
    uVar13 = 0x3ff;
    if (bd != 10) {
      uVar13 = uVar15;
    }
    prepare_coeffs(filter_params_x,subpel_x_qn,&local_e0);
    auVar10._2_2_ = uVar13;
    auVar10._0_2_ = uVar13;
    auVar10._4_2_ = uVar13;
    auVar10._6_2_ = uVar13;
    auVar10._8_2_ = uVar13;
    auVar10._10_2_ = uVar13;
    auVar10._12_2_ = uVar13;
    auVar10._14_2_ = uVar13;
    auVar10._16_2_ = uVar13;
    auVar10._18_2_ = uVar13;
    auVar10._20_2_ = uVar13;
    auVar10._22_2_ = uVar13;
    auVar10._24_2_ = uVar13;
    auVar10._26_2_ = uVar13;
    auVar10._28_2_ = uVar13;
    auVar10._30_2_ = uVar13;
    auVar11._4_4_ = iVar18;
    auVar11._0_4_ = iVar18;
    auVar11._8_4_ = iVar18;
    auVar11._12_4_ = iVar18;
    auVar11._16_4_ = iVar18;
    auVar11._20_4_ = iVar18;
    auVar11._24_4_ = iVar18;
    auVar11._28_4_ = iVar18;
    auVar12._4_4_ = iVar16;
    auVar12._0_4_ = iVar16;
    auVar12._8_4_ = iVar16;
    auVar12._12_4_ = iVar16;
    auVar12._16_4_ = iVar16;
    auVar12._20_4_ = iVar16;
    auVar12._24_4_ = iVar16;
    auVar12._28_4_ = iVar16;
    lVar14 = (long)dst_stride;
    for (lVar19 = 0; lVar19 < w; lVar19 = lVar19 + 8) {
      pauVar20 = (undefined1 (*) [16])dst;
      pauVar23 = pauVar21;
      for (lVar22 = 0; lVar22 < h; lVar22 = lVar22 + 2) {
        auVar8 = vperm2i128_avx2(*pauVar23,*(undefined1 (*) [32])(*pauVar23 + (long)src_stride * 2),
                                 0x20);
        auVar9 = vperm2i128_avx2(*pauVar23,*(undefined1 (*) [32])(*pauVar23 + (long)src_stride * 2),
                                 0x31);
        auVar2 = vpalignr_avx2(auVar9,auVar8,4);
        auVar3 = vpalignr_avx2(auVar9,auVar8,8);
        auVar4 = vpalignr_avx2(auVar9,auVar8,0xc);
        auVar5 = vpmaddwd_avx2(auVar8,(undefined1  [32])local_e0);
        auVar6 = vpmaddwd_avx2(auVar2,local_c0);
        auVar2 = vpmaddwd_avx2(auVar3,local_a0);
        auVar3 = vpmaddwd_avx2(auVar4,local_80);
        auVar2 = vpaddd_avx2(auVar2,auVar3);
        auVar3 = vpaddd_avx2(auVar5,auVar12);
        auVar3 = vpaddd_avx2(auVar3,auVar6);
        auVar2 = vpaddd_avx2(auVar2,auVar3);
        auVar7 = vpsrad_avx2(auVar2,ZEXT416(uVar1));
        auVar2 = vpalignr_avx2(auVar9,auVar8,2);
        auVar3 = vpalignr_avx2(auVar9,auVar8,6);
        auVar4 = vpalignr_avx2(auVar9,auVar8,10);
        auVar5 = vpalignr_avx2(auVar9,auVar8,0xe);
        auVar6 = vpmaddwd_avx2(auVar2,(undefined1  [32])local_e0);
        auVar2 = vpmaddwd_avx2(auVar3,local_c0);
        auVar3 = vpmaddwd_avx2(auVar4,local_a0);
        auVar2 = vpaddd_avx2(auVar2,auVar3);
        auVar4 = vpmaddwd_avx2(auVar5,local_80);
        auVar3 = vpaddd_avx2(auVar12,auVar6);
        auVar2 = vpaddd_avx2(auVar2,auVar3);
        auVar2 = vpaddd_avx2(auVar2,auVar4);
        auVar3 = vpsrad_avx2(auVar2,ZEXT416(uVar1));
        auVar2 = vpaddd_avx2(auVar11,auVar7);
        auVar2 = vpsrad_avx2(auVar2,ZEXT416(uVar17));
        auVar2 = vpackssdw_avx2(auVar2,(undefined1  [32])local_e0);
        auVar3 = vpaddd_avx2(auVar11,auVar3);
        auVar3 = vpsrad_avx2(auVar3,ZEXT416(uVar17));
        auVar3 = vpackssdw_avx2(auVar3,(undefined1  [32])local_e0);
        auVar2 = vpunpcklwd_avx2(auVar2,auVar3);
        auVar2 = vpminsw_avx2(auVar10,auVar2);
        auVar2 = vpmaxsw_avx2(auVar2,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        if (lVar19 < (long)w + -4) {
          *pauVar20 = auVar2._0_16_;
          *(undefined1 (*) [16])((long)*pauVar20 + lVar14 * 2) = auVar2._16_16_;
        }
        else if (w == 4) {
          *(long *)*pauVar20 = auVar2._0_8_;
          *(long *)((long)*pauVar20 + lVar14 * 2) = auVar2._16_8_;
        }
        else {
          *(int *)*pauVar20 = auVar2._0_4_;
          *(int *)((long)*pauVar20 + lVar14 * 2) = auVar2._16_4_;
        }
        pauVar23 = (undefined1 (*) [32])(*pauVar23 + (long)src_stride * 4);
        pauVar20 = (undefined1 (*) [16])((long)*pauVar20 + lVar14 * 2 * 2);
      }
      pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
      dst = (uint16_t *)((long)dst + 0x10);
    }
  }
  return;
}

Assistant:

void av1_highbd_convolve_x_sr_avx2(const uint16_t *src, int src_stride,
                                   uint16_t *dst, int dst_stride, int w, int h,
                                   const InterpFilterParams *filter_params_x,
                                   const int subpel_x_qn,
                                   ConvolveParams *conv_params, int bd) {
  if (filter_params_x->taps == 12) {
    av1_highbd_convolve_x_sr_ssse3(src, src_stride, dst, dst_stride, w, h,
                                   filter_params_x, subpel_x_qn, conv_params,
                                   bd);
    return;
  }
  int i, j;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_horiz;

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  __m256i s[4], coeffs_x[4];

  const __m256i round_const_x =
      _mm256_set1_epi32(((1 << conv_params->round_0) >> 1));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);

  const int bits = FILTER_BITS - conv_params->round_0;
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  assert(bits >= 0);
  assert((FILTER_BITS - conv_params->round_1) >= 0 ||
         ((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS));

  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    for (i = 0; i < h; i += 2) {
      const __m256i row0 =
          _mm256_loadu_si256((__m256i *)&src_ptr[i * src_stride + j]);
      __m256i row1 =
          _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_stride + j]);

      const __m256i r0 = _mm256_permute2x128_si256(row0, row1, 0x20);
      const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

      // even pixels
      s[0] = _mm256_alignr_epi8(r1, r0, 0);
      s[1] = _mm256_alignr_epi8(r1, r0, 4);
      s[2] = _mm256_alignr_epi8(r1, r0, 8);
      s[3] = _mm256_alignr_epi8(r1, r0, 12);

      __m256i res_even = convolve(s, coeffs_x);
      res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_x),
                                  round_shift_x);

      // odd pixels
      s[0] = _mm256_alignr_epi8(r1, r0, 2);
      s[1] = _mm256_alignr_epi8(r1, r0, 6);
      s[2] = _mm256_alignr_epi8(r1, r0, 10);
      s[3] = _mm256_alignr_epi8(r1, r0, 14);

      __m256i res_odd = convolve(s, coeffs_x);
      res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_x),
                                 round_shift_x);

      res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_bits),
                                  round_shift_bits);
      res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_bits),
                                 round_shift_bits);

      __m256i res_even1 = _mm256_packs_epi32(res_even, res_even);
      __m256i res_odd1 = _mm256_packs_epi32(res_odd, res_odd);

      __m256i res = _mm256_unpacklo_epi16(res_even1, res_odd1);
      res = _mm256_min_epi16(res, clip_pixel);
      res = _mm256_max_epi16(res, zero);

      if (w - j > 4) {
        _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j],
                         _mm256_castsi256_si128(res));
        _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                         _mm256_extracti128_si256(res, 1));
      } else if (w == 4) {
        _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j],
                         _mm256_castsi256_si128(res));
        _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                         _mm256_extracti128_si256(res, 1));
      } else {
        xx_storel_32(&dst[i * dst_stride + j], _mm256_castsi256_si128(res));
        xx_storel_32(&dst[i * dst_stride + j + dst_stride],
                     _mm256_extracti128_si256(res, 1));
      }
    }
  }
}